

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.h
# Opt level: O2

void __thiscall MeshLib::FaceHalfedgeIterator::operator++(FaceHalfedgeIterator *this)

{
  HalfEdge *pHVar1;
  TopologyException *this_00;
  HalfEdge *pHVar2;
  
  if (this->m_halfedge != (tHalfEdge)0x0) {
    pHVar1 = this->m_halfedge->m_next;
    this->m_halfedge = pHVar1;
    pHVar2 = (HalfEdge *)0x0;
    if (pHVar1 != this->m_face->m_halfedge) {
      pHVar2 = pHVar1;
    }
    this->m_halfedge = pHVar2;
    return;
  }
  this_00 = (TopologyException *)__cxa_allocate_exception(8);
  TopologyException::TopologyException(this_00,"iterators");
  __cxa_throw(this_00,&TopologyException::typeinfo,TopologyException::~TopologyException);
}

Assistant:

void operator++()
	{
		if( m_halfedge == NULL ) throw TopologyException("iterators");
		m_halfedge = m_halfedge->he_next();

		if( m_halfedge == m_face->halfedge() )
		{
			 m_halfedge = NULL;
			return;
		};
	}